

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void __thiscall
ByteCodeGenerator::MapCacheIdsToPropertyIds(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  uint rootObjectLoadInlineCacheStart;
  uint uVar1;
  PropertyId propertyId;
  InlineCacheMap *pIVar2;
  BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar3;
  Type pSVar4;
  SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount> *pSVar5;
  undefined8 uVar6;
  RootObjectInlineCacheIdMap *pRVar7;
  Type pSVar8;
  code *pcVar9;
  bool bVar10;
  FunctionBody *this_00;
  NodeBase *pNVar11;
  Type *pTVar12;
  Type *pTVar13;
  ulong uVar14;
  uint rootObjectLoadMethodInlineCacheStart;
  int iVar15;
  ulong uVar16;
  int iVar17;
  uint rootObjectStoreInlineCacheStart;
  uint uVar18;
  undefined1 local_70 [8];
  Iterator toStringIter;
  undefined1 local_48 [8];
  Iterator valueOfIter;
  
  this_00 = FuncInfo::GetParsedFunctionBody(funcInfo);
  rootObjectLoadInlineCacheStart = funcInfo->inlineCacheCount;
  rootObjectLoadMethodInlineCacheStart =
       funcInfo->rootObjectLoadInlineCacheCount + rootObjectLoadInlineCacheStart;
  rootObjectStoreInlineCacheStart =
       funcInfo->rootObjectLoadMethodInlineCacheCount + rootObjectLoadMethodInlineCacheStart;
  uVar1 = funcInfo->rootObjectStoreInlineCacheCount;
  Js::FunctionBody::CreateCacheIdToPropertyIdMap
            (this_00,rootObjectLoadInlineCacheStart,rootObjectLoadMethodInlineCacheStart,
             rootObjectStoreInlineCacheStart,rootObjectStoreInlineCacheStart + uVar1,
             funcInfo->isInstInlineCacheCount);
  if (uVar1 + rootObjectStoreInlineCacheStart == 0) {
    return;
  }
  pIVar2 = funcInfo->inlineCacheMap;
  pNVar11 = (NodeBase *)__tls_get_addr(&PTR_013e5f18);
  valueOfIter.current = pNVar11;
  for (uVar16 = 0; uVar16 < pIVar2->bucketCount; uVar16 = uVar16 + 1) {
    iVar15 = pIVar2->buckets[uVar16];
    if (pIVar2->buckets[uVar16] != -1) {
      while (iVar15 != -1) {
        toStringIter.current._4_4_ =
             pIVar2->entries[iVar15].
             super_DefaultHashedEntry<unsigned_int,_JsUtil::BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
             .
             super_KeyValueEntry<unsigned_int,_JsUtil::BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_*>
             .
             super_ValueEntry<JsUtil::BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_JsUtil::BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_*>_>
             .
             super_KeyValueEntryDataLayout2<unsigned_int,_JsUtil::BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_*>
             .next;
        pBVar3 = pIVar2->entries[iVar15].
                 super_DefaultHashedEntry<unsigned_int,_JsUtil::BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                 .
                 super_KeyValueEntry<unsigned_int,_JsUtil::BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_*>
                 .
                 super_ValueEntry<JsUtil::BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_JsUtil::BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_*>_>
                 .
                 super_KeyValueEntryDataLayout2<unsigned_int,_JsUtil::BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_*>
                 .value;
        for (uVar14 = 0; pNVar11 = valueOfIter.current, iVar15 = toStringIter.current._4_4_,
            uVar14 < pBVar3->bucketCount; uVar14 = uVar14 + 1) {
          iVar15 = pBVar3->buckets[uVar14];
          if (pBVar3->buckets[uVar14] != -1) {
            while (iVar17 = iVar15, iVar17 != -1) {
              pSVar4 = pBVar3->entries;
              iVar15 = *(int *)((long)&pSVar4[iVar17].
                                       super_DefaultHashedEntry<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                                       .
                                       super_KeyValueEntry<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*>
                               + 8);
              pSVar5 = *(SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount> **)
                        &pSVar4[iVar17].
                         super_DefaultHashedEntry<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                         .
                         super_KeyValueEntry<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*>
              ;
              if (pSVar5 != (SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount> *)0x0) {
                propertyId = *(int *)((long)&pSVar4[iVar17].
                                             super_DefaultHashedEntry<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                                             .
                                             super_KeyValueEntry<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*>
                                     + 0xc);
                toStringIter.current._0_4_ = iVar15;
                local_48 = (undefined1  [8])pSVar5;
                valueOfIter.list = pSVar5;
                while( true ) {
                  if (valueOfIter.list ==
                      (SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount> *)0x0) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    pNVar11 = valueOfIter.current;
                    *(undefined4 *)&(valueOfIter.current)->next = 1;
                    bVar10 = Js::Throw::ReportAssert
                                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                        ,0x76,"(current != nullptr)","current != nullptr");
                    if (!bVar10) goto LAB_00762a2f;
                    *(undefined4 *)&pNVar11->next = 0;
                  }
                  pSVar5 = (SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount> *)
                           ((valueOfIter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
                  iVar15 = (int)toStringIter.current;
                  if ((undefined1  [8])pSVar5 == local_48) break;
                  valueOfIter.list = pSVar5;
                  pTVar12 = SListBase<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>::Iterator
                            ::Data((Iterator *)local_48);
                  uVar6 = *(undefined8 *)&pTVar12->field_0;
                  uVar1 = (pTVar12->field_0).field_0.storeCacheId;
                  uVar18 = (uint)uVar6;
                  if (uVar18 != 0xffffffff) {
                    Js::FunctionBody::SetPropertyIdForCacheId(this_00,uVar18,propertyId);
                  }
                  uVar18 = (uint)((ulong)uVar6 >> 0x20);
                  if (uVar18 != 0xffffffff) {
                    Js::FunctionBody::SetPropertyIdForCacheId(this_00,uVar18,propertyId);
                  }
                  if (uVar1 != 0xffffffff) {
                    Js::FunctionBody::SetPropertyIdForCacheId(this_00,uVar1,propertyId);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  pRVar7 = funcInfo->rootObjectLoadInlineCacheMap;
  for (uVar16 = 0; uVar16 < pRVar7->bucketCount; uVar16 = uVar16 + 1) {
    iVar15 = pRVar7->buckets[uVar16];
    if (pRVar7->buckets[uVar16] != -1) {
      while (iVar15 != -1) {
        pSVar8 = pRVar7->entries;
        iVar17 = pSVar8[iVar15].
                 super_DefaultHashedEntry<int,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                 .super_KeyValueEntry<int,_unsigned_int>.
                 super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_unsigned_int>_>
                 .super_KeyValueEntryDataLayout2<int,_unsigned_int>.next;
        Js::FunctionBody::SetPropertyIdForCacheId
                  (this_00,pSVar8[iVar15].
                           super_DefaultHashedEntry<int,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                           .super_KeyValueEntry<int,_unsigned_int>.
                           super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_unsigned_int>_>
                           .super_KeyValueEntryDataLayout2<int,_unsigned_int>.value +
                           rootObjectLoadInlineCacheStart,
                   pSVar8[iVar15].
                   super_DefaultHashedEntry<int,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                   .super_KeyValueEntry<int,_unsigned_int>.
                   super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_unsigned_int>_>
                   .super_KeyValueEntryDataLayout2<int,_unsigned_int>.key);
        pNVar11 = valueOfIter.current;
        iVar15 = iVar17;
      }
    }
  }
  pRVar7 = funcInfo->rootObjectLoadMethodInlineCacheMap;
  for (uVar16 = 0; uVar16 < pRVar7->bucketCount; uVar16 = uVar16 + 1) {
    iVar15 = pRVar7->buckets[uVar16];
    if (pRVar7->buckets[uVar16] != -1) {
      while (iVar15 != -1) {
        pSVar8 = pRVar7->entries;
        iVar17 = pSVar8[iVar15].
                 super_DefaultHashedEntry<int,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                 .super_KeyValueEntry<int,_unsigned_int>.
                 super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_unsigned_int>_>
                 .super_KeyValueEntryDataLayout2<int,_unsigned_int>.next;
        Js::FunctionBody::SetPropertyIdForCacheId
                  (this_00,pSVar8[iVar15].
                           super_DefaultHashedEntry<int,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                           .super_KeyValueEntry<int,_unsigned_int>.
                           super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_unsigned_int>_>
                           .super_KeyValueEntryDataLayout2<int,_unsigned_int>.value +
                           rootObjectLoadMethodInlineCacheStart,
                   pSVar8[iVar15].
                   super_DefaultHashedEntry<int,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                   .super_KeyValueEntry<int,_unsigned_int>.
                   super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_unsigned_int>_>
                   .super_KeyValueEntryDataLayout2<int,_unsigned_int>.key);
        pNVar11 = valueOfIter.current;
        iVar15 = iVar17;
      }
    }
  }
  pRVar7 = funcInfo->rootObjectStoreInlineCacheMap;
  for (uVar16 = 0; uVar16 < pRVar7->bucketCount; uVar16 = uVar16 + 1) {
    iVar15 = pRVar7->buckets[uVar16];
    if (pRVar7->buckets[uVar16] != -1) {
      while (iVar15 != -1) {
        pSVar8 = pRVar7->entries;
        iVar17 = pSVar8[iVar15].
                 super_DefaultHashedEntry<int,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                 .super_KeyValueEntry<int,_unsigned_int>.
                 super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_unsigned_int>_>
                 .super_KeyValueEntryDataLayout2<int,_unsigned_int>.next;
        Js::FunctionBody::SetPropertyIdForCacheId
                  (this_00,pSVar8[iVar15].
                           super_DefaultHashedEntry<int,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                           .super_KeyValueEntry<int,_unsigned_int>.
                           super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_unsigned_int>_>
                           .super_KeyValueEntryDataLayout2<int,_unsigned_int>.value +
                           rootObjectStoreInlineCacheStart,
                   pSVar8[iVar15].
                   super_DefaultHashedEntry<int,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                   .super_KeyValueEntry<int,_unsigned_int>.
                   super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_unsigned_int>_>
                   .super_KeyValueEntryDataLayout2<int,_unsigned_int>.key);
        pNVar11 = valueOfIter.current;
        iVar15 = iVar17;
      }
    }
  }
  local_48 = (undefined1  [8])&funcInfo->valueOfStoreCacheIds;
  valueOfIter.list = (SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount> *)local_48;
  while( true ) {
    if (valueOfIter.list == (SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)&pNVar11->next = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                          ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar10) goto LAB_00762a2f;
      *(undefined4 *)&pNVar11->next = 0;
    }
    valueOfIter.list =
         (SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount> *)
         ((valueOfIter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
    if ((undefined1  [8])valueOfIter.list == local_48) break;
    pTVar13 = SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)local_48);
    Js::FunctionBody::SetPropertyIdForCacheId(this_00,*pTVar13,0x18e);
    pNVar11 = valueOfIter.current;
  }
  valueOfIter.list = (SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount> *)0x0;
  local_70 = (undefined1  [8])&funcInfo->toStringStoreCacheIds;
  toStringIter.list = (SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount> *)local_70;
  do {
    if (toStringIter.list == (SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)&pNVar11->next = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                          ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar10) {
LAB_00762a2f:
        pcVar9 = (code *)invalidInstructionException();
        (*pcVar9)();
      }
      *(undefined4 *)&pNVar11->next = 0;
    }
    toStringIter.list =
         (SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount> *)
         ((toStringIter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
    if ((undefined1  [8])toStringIter.list == local_70) {
      toStringIter.list = (SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount> *)0x0;
      Js::FunctionBody::VerifyCacheIdToPropertyIdMap(this_00);
      return;
    }
    pTVar13 = SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)local_70);
    Js::FunctionBody::SetPropertyIdForCacheId(this_00,*pTVar13,0x178);
    pNVar11 = valueOfIter.current;
  } while( true );
}

Assistant:

void ByteCodeGenerator::MapCacheIdsToPropertyIds(FuncInfo *funcInfo)
{
    Js::FunctionBody *functionBody = funcInfo->GetParsedFunctionBody();
    uint rootObjectLoadInlineCacheStart = funcInfo->GetInlineCacheCount();
    uint rootObjectLoadMethodInlineCacheStart = rootObjectLoadInlineCacheStart + funcInfo->GetRootObjectLoadInlineCacheCount();
    uint rootObjectStoreInlineCacheStart = rootObjectLoadMethodInlineCacheStart + funcInfo->GetRootObjectLoadMethodInlineCacheCount();
    uint totalFieldAccessInlineCacheCount = rootObjectStoreInlineCacheStart + funcInfo->GetRootObjectStoreInlineCacheCount();

    functionBody->CreateCacheIdToPropertyIdMap(rootObjectLoadInlineCacheStart, rootObjectLoadMethodInlineCacheStart,
        rootObjectStoreInlineCacheStart, totalFieldAccessInlineCacheCount, funcInfo->GetIsInstInlineCacheCount());

    if (totalFieldAccessInlineCacheCount == 0)
    {
        return;
    }

    funcInfo->inlineCacheMap->Map([functionBody](Js::RegSlot regSlot, FuncInfo::InlineCacheIdMap *inlineCacheIdMap)
    {
        inlineCacheIdMap->Map([functionBody](Js::PropertyId propertyId, FuncInfo::InlineCacheList* inlineCacheList)
        {
            if (inlineCacheList)
            {
                inlineCacheList->Iterate([functionBody, propertyId](InlineCacheUnit cacheUnit)
                {
                    CompileAssert(offsetof(InlineCacheUnit, cacheId) == offsetof(InlineCacheUnit, loadCacheId));
                    if (cacheUnit.loadCacheId != -1)
                    {
                        functionBody->SetPropertyIdForCacheId(cacheUnit.loadCacheId, propertyId);
                    }
                    if (cacheUnit.loadMethodCacheId != -1)
                    {
                        functionBody->SetPropertyIdForCacheId(cacheUnit.loadMethodCacheId, propertyId);
                    }
                    if (cacheUnit.storeCacheId != -1)
                    {
                        functionBody->SetPropertyIdForCacheId(cacheUnit.storeCacheId, propertyId);
                    }
                });
            }
        });
    });

    funcInfo->rootObjectLoadInlineCacheMap->Map([functionBody, rootObjectLoadInlineCacheStart](Js::PropertyId propertyId, uint cacheId)
    {
        functionBody->SetPropertyIdForCacheId(cacheId + rootObjectLoadInlineCacheStart, propertyId);
    });
    funcInfo->rootObjectLoadMethodInlineCacheMap->Map([functionBody, rootObjectLoadMethodInlineCacheStart](Js::PropertyId propertyId, uint cacheId)
    {
        functionBody->SetPropertyIdForCacheId(cacheId + rootObjectLoadMethodInlineCacheStart, propertyId);
    });
    funcInfo->rootObjectStoreInlineCacheMap->Map([functionBody, rootObjectStoreInlineCacheStart](Js::PropertyId propertyId, uint cacheId)
    {
        functionBody->SetPropertyIdForCacheId(cacheId + rootObjectStoreInlineCacheStart, propertyId);
    });

    SListBase<uint>::Iterator valueOfIter(&funcInfo->valueOfStoreCacheIds);
    while (valueOfIter.Next())
    {
        functionBody->SetPropertyIdForCacheId(valueOfIter.Data(), Js::PropertyIds::valueOf);
    }

    SListBase<uint>::Iterator toStringIter(&funcInfo->toStringStoreCacheIds);
    while (toStringIter.Next())
    {
        functionBody->SetPropertyIdForCacheId(toStringIter.Data(), Js::PropertyIds::toString);
    }

#if DBG
    functionBody->VerifyCacheIdToPropertyIdMap();
#endif
}